

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

void SetOptionInteger(TidyDocImpl *doc,TidyOptionId optId,ulong val)

{
  TidyOptionValue *pTVar1;
  bool bVar2;
  Bool fire_callback;
  ulong *optVal;
  TidyOptionImpl *option;
  ulong val_local;
  TidyOptionId optId_local;
  TidyDocImpl *doc_local;
  
  pTVar1 = (doc->config).value + optId;
  bVar2 = false;
  if (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0) {
    bVar2 = pTVar1->v != val;
  }
  pTVar1->v = val;
  if (bVar2) {
    PerformOptionChangedCallback(doc,option_defs + optId);
  }
  return;
}

Assistant:

static void SetOptionInteger( TidyDocImpl* doc, TidyOptionId optId, ulong val )
{
    const TidyOptionImpl* option = &option_defs[ optId ];
    ulong* optVal = &(doc->config.value[ optId ].v);
    Bool fire_callback = doc->pConfigChangeCallback && *optVal != val;

    *optVal = val;

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );
}